

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Cut_t * Lf_MemLoadCut(Lf_Mem_t *p,int iCur,int iObj,Lf_Cut_t *pCut,int fTruth,int fRecycle)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  word wVar4;
  uint i;
  Vec_Ptr_t *p_01;
  ulong uVar5;
  uchar *pPlace;
  
  i = (uint)iCur >> ((byte)p->LogPage & 0x1f);
  if ((p->vPages).nSize <= (int)i) {
    __assert_fail("Page < Vec_PtrSize(&p->vPages)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x227,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  p_01 = &p->vPages;
  pvVar3 = Vec_PtrEntry(p_01,i);
  pPlace = (uchar *)((ulong)(uint)(iCur & p->MaskPage) + (long)pvVar3);
  uVar1 = Gia_AigerReadUnsigned(&pPlace);
  pCut->field_0x17 = (char)uVar1;
  if (0xc < (uVar1 & 0xff)) {
    __assert_fail("pCut->nLeaves <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x22a,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  for (uVar5 = (ulong)(uVar1 & 0xff); 0 < (long)uVar5; uVar5 = uVar5 - 1) {
    uVar2 = Gia_AigerReadUnsigned(&pPlace);
    iObj = iObj - uVar2;
    *(int *)(&pCut->field_0x14 + uVar5 * 4) = iObj;
  }
  if (fTruth == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = Gia_AigerReadUnsigned(&pPlace);
  }
  pCut->iFunc = uVar2;
  if (3 < (int)uVar2 && uVar1 << 0x18 < 0x2000000) {
    __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x22e,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if (i == 0 || fRecycle == 0) {
    if (fRecycle == 0) {
      wVar4 = 0;
      goto LAB_005929e0;
    }
  }
  else {
    uVar1 = i - 1;
    pvVar3 = Vec_PtrEntry(p_01,uVar1);
    if (pvVar3 != (void *)0x0) {
      p_00 = p->vFree;
      pvVar3 = Vec_PtrEntry(p_01,uVar1);
      Vec_PtrPush(p_00,pvVar3);
      if ((p->vPages).nSize < (int)i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vPages).pArray[uVar1] = (void *)0x0;
    }
  }
  wVar4 = Lf_CutGetSign(pCut);
LAB_005929e0:
  pCut->Sign = wVar4;
  pCut->field_0x16 = pCut->field_0x16 & 0x7f;
  return pCut;
}

Assistant:

static inline Lf_Cut_t * Lf_MemLoadCut( Lf_Mem_t * p, int iCur, int iObj, Lf_Cut_t * pCut, int fTruth, int fRecycle )
{
    unsigned char * pPlace;  
    int i, Prev = iObj, Page = iCur >> p->LogPage;
    assert( Page < Vec_PtrSize(&p->vPages) );
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, Page) + (iCur & p->MaskPage);
    pCut->nLeaves = Gia_AigerReadUnsigned(&pPlace);
    assert( pCut->nLeaves <= LF_LEAF_MAX );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        pCut->pLeaves[i] = Prev - Gia_AigerReadUnsigned(&pPlace), Prev = pCut->pLeaves[i];
    pCut->iFunc = fTruth ? Gia_AigerReadUnsigned(&pPlace) : -1;
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( fRecycle && Page && Vec_PtrEntry(&p->vPages, Page-1) )
    {
        Vec_PtrPush( p->vFree, Vec_PtrEntry(&p->vPages, Page-1) );
        Vec_PtrWriteEntry( &p->vPages, Page-1, NULL );
    }
    pCut->Sign = fRecycle ? Lf_CutGetSign(pCut) : 0;
    pCut->fMux7 = 0;
    return pCut;
}